

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_braid_c.c
# Opt level: O0

uint32_t crc32_braid(uint32_t crc,uint8_t *buf,size_t len)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  z_word_t word4;
  z_word_t crc4;
  z_word_t word3;
  z_word_t crc3;
  z_word_t word2;
  z_word_t crc2;
  z_word_t word1;
  z_word_t crc1;
  z_word_t comb;
  z_word_t word0;
  z_word_t crc0;
  ulong *puStack_38;
  int k;
  z_word_t *words;
  size_t blks;
  size_t sStack_20;
  uint32_t c;
  size_t len_local;
  uint8_t *buf_local;
  uint32_t crc_local;
  
  blks._4_4_ = crc ^ 0xffffffff;
  sStack_20 = len;
  len_local = (size_t)buf;
  if (0x2e < len) {
    for (; sStack_20 != 0 && (len_local & 7) != 0; sStack_20 = sStack_20 - 1) {
      blks._4_4_ = crc_table[(blks._4_4_ ^ *(byte *)len_local) & 0xff] ^ blks._4_4_ >> 8;
      len_local = len_local + 1;
    }
    words = (z_word_t *)(sStack_20 / 0x28);
    sStack_20 = sStack_20 % 0x28;
    puStack_38 = (ulong *)len_local;
    word0 = (z_word_t)blks._4_4_;
    word1 = 0;
    word2 = 0;
    word3 = 0;
    word4 = 0;
    while (words = (z_word_t *)((long)words + -1), words != (z_word_t *)0x0) {
      uVar3 = word0 ^ *puStack_38;
      uVar4 = word1 ^ puStack_38[1];
      uVar5 = word2 ^ puStack_38[2];
      uVar6 = word3 ^ puStack_38[3];
      uVar7 = word4 ^ puStack_38[4];
      puStack_38 = puStack_38 + 5;
      word0 = (z_word_t)crc_braid_table[0][uVar3 & 0xff];
      word1 = (z_word_t)crc_braid_table[0][uVar4 & 0xff];
      word2 = (z_word_t)crc_braid_table[0][uVar5 & 0xff];
      word3 = (z_word_t)crc_braid_table[0][uVar6 & 0xff];
      word4 = (z_word_t)crc_braid_table[0][uVar7 & 0xff];
      for (crc0._4_4_ = 1; crc0._4_4_ < 8; crc0._4_4_ = crc0._4_4_ + 1) {
        word0 = crc_braid_table[crc0._4_4_][uVar3 >> ((byte)(crc0._4_4_ << 3) & 0x3f) & 0xff] ^
                word0;
        word1 = crc_braid_table[crc0._4_4_][uVar4 >> ((byte)(crc0._4_4_ << 3) & 0x3f) & 0xff] ^
                word1;
        word2 = crc_braid_table[crc0._4_4_][uVar5 >> ((byte)(crc0._4_4_ << 3) & 0x3f) & 0xff] ^
                word2;
        word3 = crc_braid_table[crc0._4_4_][uVar6 >> ((byte)(crc0._4_4_ << 3) & 0x3f) & 0xff] ^
                word3;
        word4 = crc_braid_table[crc0._4_4_][uVar7 >> ((byte)(crc0._4_4_ << 3) & 0x3f) & 0xff] ^
                word4;
      }
    }
    uVar1 = crc_word(word0 ^ *puStack_38);
    uVar1 = crc_word(word1 ^ puStack_38[1] ^ (ulong)uVar1);
    uVar1 = crc_word(word2 ^ puStack_38[2] ^ (ulong)uVar1);
    uVar1 = crc_word(word3 ^ puStack_38[3] ^ (ulong)uVar1);
    blks._4_4_ = crc_word(word4 ^ puStack_38[4] ^ (ulong)uVar1);
    len_local = (size_t)(puStack_38 + 5);
  }
  for (; 7 < sStack_20; sStack_20 = sStack_20 - 8) {
    uVar2 = crc_table[(blks._4_4_ ^ *(byte *)len_local) & 0xff] ^ blks._4_4_ >> 8;
    uVar2 = crc_table[(uVar2 ^ *(byte *)(len_local + 1)) & 0xff] ^ uVar2 >> 8;
    uVar2 = crc_table[(uVar2 ^ *(byte *)(len_local + 2)) & 0xff] ^ uVar2 >> 8;
    uVar2 = crc_table[(uVar2 ^ *(byte *)(len_local + 3)) & 0xff] ^ uVar2 >> 8;
    uVar2 = crc_table[(uVar2 ^ *(byte *)(len_local + 4)) & 0xff] ^ uVar2 >> 8;
    uVar2 = crc_table[(uVar2 ^ *(byte *)(len_local + 5)) & 0xff] ^ uVar2 >> 8;
    pbVar8 = (byte *)(len_local + 7);
    uVar2 = crc_table[(uVar2 ^ *(byte *)(len_local + 6)) & 0xff] ^ uVar2 >> 8;
    len_local = len_local + 8;
    blks._4_4_ = crc_table[(uVar2 ^ *pbVar8) & 0xff] ^ uVar2 >> 8;
  }
  for (; sStack_20 != 0; sStack_20 = sStack_20 - 1) {
    blks._4_4_ = crc_table[(blks._4_4_ ^ *(byte *)len_local) & 0xff] ^ blks._4_4_ >> 8;
    len_local = len_local + 1;
  }
  return blks._4_4_ ^ 0xffffffff;
}

Assistant:

Z_INTERNAL uint32_t PREFIX(crc32_braid)(uint32_t crc, const uint8_t *buf, size_t len) {
    uint32_t c;

    /* Pre-condition the CRC */
    c = (~crc) & 0xffffffff;

#ifdef W
    /* If provided enough bytes, do a braided CRC calculation. */
    if (len >= N * W + W - 1) {
        size_t blks;
        z_word_t const *words;
        int k;

        /* Compute the CRC up to a z_word_t boundary. */
        while (len && ((uintptr_t)buf & (W - 1)) != 0) {
            len--;
            DO1;
        }

        /* Compute the CRC on as many N z_word_t blocks as are available. */
        blks = len / (N * W);
        len -= blks * N * W;
        words = (z_word_t const *)buf;

        z_word_t crc0, word0, comb;
#if N > 1
        z_word_t crc1, word1;
#if N > 2
        z_word_t crc2, word2;
#if N > 3
        z_word_t crc3, word3;
#if N > 4
        z_word_t crc4, word4;
#if N > 5
        z_word_t crc5, word5;
#endif
#endif
#endif
#endif
#endif
        /* Initialize the CRC for each braid. */
        crc0 = ZSWAPWORD(c);
#if N > 1
        crc1 = 0;
#if N > 2
        crc2 = 0;
#if N > 3
        crc3 = 0;
#if N > 4
        crc4 = 0;
#if N > 5
        crc5 = 0;
#endif
#endif
#endif
#endif
#endif
        /* Process the first blks-1 blocks, computing the CRCs on each braid independently. */
        while (--blks) {
            /* Load the word for each braid into registers. */
            word0 = crc0 ^ words[0];
#if N > 1
            word1 = crc1 ^ words[1];
#if N > 2
            word2 = crc2 ^ words[2];
#if N > 3
            word3 = crc3 ^ words[3];
#if N > 4
            word4 = crc4 ^ words[4];
#if N > 5
            word5 = crc5 ^ words[5];
#endif
#endif
#endif
#endif
#endif
            words += N;

            /* Compute and update the CRC for each word. The loop should get unrolled. */
            crc0 = BRAID_TABLE[0][word0 & 0xff];
#if N > 1
            crc1 = BRAID_TABLE[0][word1 & 0xff];
#if N > 2
            crc2 = BRAID_TABLE[0][word2 & 0xff];
#if N > 3
            crc3 = BRAID_TABLE[0][word3 & 0xff];
#if N > 4
            crc4 = BRAID_TABLE[0][word4 & 0xff];
#if N > 5
            crc5 = BRAID_TABLE[0][word5 & 0xff];
#endif
#endif
#endif
#endif
#endif
            for (k = 1; k < W; k++) {
                crc0 ^= BRAID_TABLE[k][(word0 >> (k << 3)) & 0xff];
#if N > 1
                crc1 ^= BRAID_TABLE[k][(word1 >> (k << 3)) & 0xff];
#if N > 2
                crc2 ^= BRAID_TABLE[k][(word2 >> (k << 3)) & 0xff];
#if N > 3
                crc3 ^= BRAID_TABLE[k][(word3 >> (k << 3)) & 0xff];
#if N > 4
                crc4 ^= BRAID_TABLE[k][(word4 >> (k << 3)) & 0xff];
#if N > 5
                crc5 ^= BRAID_TABLE[k][(word5 >> (k << 3)) & 0xff];
#endif
#endif
#endif
#endif
#endif
            }
        }

        /* Process the last block, combining the CRCs of the N braids at the same time. */
        comb = crc_word(crc0 ^ words[0]);
#if N > 1
        comb = crc_word(crc1 ^ words[1] ^ comb);
#if N > 2
        comb = crc_word(crc2 ^ words[2] ^ comb);
#if N > 3
        comb = crc_word(crc3 ^ words[3] ^ comb);
#if N > 4
        comb = crc_word(crc4 ^ words[4] ^ comb);
#if N > 5
        comb = crc_word(crc5 ^ words[5] ^ comb);
#endif
#endif
#endif
#endif
#endif
        words += N;
        Assert(comb <= UINT32_MAX, "comb should fit in uint32_t");
        c = (uint32_t)ZSWAPWORD(comb);

        /* Update the pointer to the remaining bytes to process. */
        buf = (const unsigned char *)words;
    }

#endif /* W */

    /* Complete the computation of the CRC on any remaining bytes. */
    while (len >= 8) {
        len -= 8;
        DO8;
    }
    while (len) {
        len--;
        DO1;
    }

    /* Return the CRC, post-conditioned. */
    return c ^ 0xffffffff;
}